

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ArbitrarySymbolExpression::fromSyntax
          (Compilation *comp,NameSyntax *syntax,ASTContext *context,
          bitmask<slang::ast::LookupFlags> extraLookupFlags)

{
  Type *args_2;
  Symbol *args_1;
  ArbitrarySymbolExpression *pAVar1;
  Scope *args;
  HierarchicalReference hierRef;
  LookupResult result;
  HierarchicalReference *local_2b8;
  SourceRange local_2b0;
  HierarchicalReference local_2a0;
  LookupResult local_278;
  
  local_278.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)local_278.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  local_278.found = (Symbol *)0x0;
  local_278.systemSubroutine._0_5_ = 0;
  local_278.systemSubroutine._5_3_ = 0;
  local_278.upwardCount = 0;
  local_278.flags.m_bits = '\0';
  local_278.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  local_278.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                firstElement;
  local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_278.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  Lookup::name(syntax,context,(bitmask<slang::ast::LookupFlags>)(extraLookupFlags.m_bits | 0x92),
               &local_278);
  LookupResult::reportDiags(&local_278,context);
  args_1 = local_278.found;
  if (local_278.found == (Symbol *)0x0) {
    args = (Scope *)0x0;
    pAVar1 = (ArbitrarySymbolExpression *)Expression::badExpr(comp,(Expression *)0x0);
  }
  else {
    Compilation::noteReference
              (comp,local_278.found,(bool)((byte)((uint)(context->flags).m_bits >> 0x14) & 1));
    HierarchicalReference::fromLookup(&local_2a0,comp,&local_278);
    args = (context->scope).ptr;
    args_2 = comp->voidType;
    local_2b8 = &local_2a0;
    local_2b0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pAVar1 = BumpAllocator::
             emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange>
                       (&comp->super_BumpAllocator,args,args_1,args_2,&local_2b8,&local_2b0);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_278.diagnostics,(EVP_PKEY_CTX *)args);
  if (local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ !=
      (pointer)local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
               firstElement) {
    operator_delete(local_278.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>
                    .data_);
  }
  if (local_278.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ != (pointer)local_278.selectors.
                         super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                         .firstElement) {
    operator_delete(local_278.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .data_);
  }
  return &pAVar1->super_Expression;
}

Assistant:

Expression& ArbitrarySymbolExpression::fromSyntax(Compilation& comp, const NameSyntax& syntax,
                                                  const ASTContext& context,
                                                  bitmask<LookupFlags> extraLookupFlags) {
    LookupResult result;
    Lookup::name(syntax, context,
                 LookupFlags::ForceHierarchical | LookupFlags::NoSelectors | extraLookupFlags,
                 result);
    result.reportDiags(context);

    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(comp, nullptr);

    comp.noteReference(*symbol, context.flags.has(ASTFlags::LValue));

    auto hierRef = HierarchicalReference::fromLookup(comp, result);
    return *comp.emplace<ArbitrarySymbolExpression>(*context.scope, *symbol, comp.getVoidType(),
                                                    &hierRef, syntax.sourceRange());
}